

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

bool IsCpcSpeedlockTrack(Track *track,int *weak_offset,int *weak_size)

{
  pointer puVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  int iVar5;
  Sector *this;
  Sector *this_00;
  Data *pDVar6;
  Data *pDVar7;
  int iVar8;
  CRC16 local_32;
  
  iVar4 = Track::size(track);
  if (iVar4 == 9) {
    this = Track::operator[](track,0);
    this_00 = Track::operator[](track,7);
    if (this->encoding != MFM) {
      return false;
    }
    if (this_00->encoding != MFM) {
      return false;
    }
    if (this->datarate != _250K) {
      return false;
    }
    if (this_00->datarate != _250K) {
      return false;
    }
    iVar4 = Sector::size(this);
    if ((((iVar4 == 0x200) && (iVar4 = Sector::size(this_00), iVar4 == 0x200)) &&
        (iVar4 = Sector::data_size(this), 0x1ff < iVar4)) &&
       ((iVar4 = Sector::data_size(this_00), 0x1ff < iVar4 &&
        (bVar2 = Sector::has_baddatacrc(this_00), bVar2)))) {
      pDVar6 = Sector::data_copy(this,0);
      pDVar7 = Sector::data_copy(this_00,0);
      puVar1 = (pDVar6->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((puVar1[0x109] == 'K' && *(long *)(puVar1 + 0x101) == 0x434f4c4445455053) ||
         (puVar1[0x89] == 'K' && *(long *)(puVar1 + 0x81) == 0x434f4c4445455053)) {
LAB_0016d85a:
        puVar1 = (pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = Sector::size(this_00);
        iVar5 = bcmp(puVar1,puVar1 + 1,(long)(iVar4 / 2 + -1));
        iVar4 = 0;
        iVar8 = 0x200;
        if (iVar5 == 0) {
          bVar2 = (pDVar6->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[0x81] == 'S';
          iVar4 = 0x150;
          if (bVar2) {
            iVar4 = 0x100;
          }
          iVar8 = 0x20;
          if (bVar2) {
            iVar8 = 0x100;
          }
        }
        *weak_offset = iVar4;
        *weak_size = iVar8;
        if (opt.debug == 0) {
          return true;
        }
        util::operator<<((LogHelper *)&util::cout,(char (*) [30])"detected CPC Speedlock track\n");
        return true;
      }
      if (*(int *)(puVar1 + 0xd8) == -0xd5b8fe && *(long *)(puVar1 + 0xd0) == 0x420000004609004a) {
        CRC16::CRC16(&local_32,puVar1 + 0x31,0xab,0xffff);
        uVar3 = CRC16::operator_cast_to_unsigned_short(&local_32);
        if (uVar3 == 0x62c2) goto LAB_0016d85a;
      }
    }
  }
  return false;
}

Assistant:

bool IsCpcSpeedlockTrack(const Track& track, int& weak_offset, int& weak_size)
{
    if (track.size() != 9)
        return false;

    auto& sector0 = track[0];
    auto& sector7 = track[7];

    if (sector0.encoding != Encoding::MFM || sector7.encoding != Encoding::MFM ||
        sector0.datarate != DataRate::_250K || sector7.datarate != DataRate::_250K ||
        sector0.size() != 512 || sector7.size() != 512 ||
        sector0.data_size() < 512 || sector7.data_size() < 512 ||
        !sector7.has_baddatacrc())  // weak sector
        return false;

    auto& data0 = sector0.data_copy();
    auto& data7 = sector7.data_copy();

    // Check for signature in the boot sector
    if (memcmp(data0.data() + 257, "SPEEDLOCK", 9) && memcmp(data0.data() + 129, "SPEEDLOCK", 9))
    {
        // If that's missing, look for a code signature
        if (memcmp(data0.data() + 208, "\x4a\x00\x09\x46\x00\x00\x00\x42\x02\x47\x2a\xff", 12) ||
            CRC16(data0.data() + 49, 220 - 49) != 0x62c2)
            return false;
    }

    // If there's no common block at the start, assume fully random
    // Buggy Boy has only 255, so don't check the full first half!
    if (memcmp(data7.data(), data7.data() + 1, (sector7.size() / 2) - 1))
    {
        // -512
        weak_offset = 0;
        weak_size = 512;
    }
    else if (data0[129] == 'S')
    {
        // =256 -256
        weak_offset = 256;
        weak_size = 256;
    }
    else
    {
        // =256 -33 +47 -176
        weak_offset = 336;
        weak_size = 32;
    }

    if (opt.debug) util::cout << "detected CPC Speedlock track\n";
    return true;
}